

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<google::protobuf::UnknownField>::Truncate
          (RepeatedField<google::protobuf::UnknownField> *this,int new_size)

{
  ulong uVar1;
  int v2;
  Nullable<const_char_*> failure_msg;
  LogMessageFatal local_30;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  v2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl(new_size,v2,"new_size <= old_size");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x4ed,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
  if (new_size < v2) {
    if ((uVar1 & 4) != 0) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    ExchangeCurrentSize(this,(uVar1 & 4) == 0,new_size);
    return;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::Truncate(int new_size) {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_LE(new_size, old_size);
  if (new_size < old_size) {
    Element* elem = unsafe_elements(is_soo);
    Destroy(elem + new_size, elem + old_size);
    ExchangeCurrentSize(is_soo, new_size);
  }
}